

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O1

bool __thiscall
OSSLEDDSA::reconstructPublicKey(OSSLEDDSA *this,PublicKey **ppPublicKey,ByteString *serialisedData)

{
  char cVar1;
  size_t sVar2;
  OSSLEDPublicKey *this_00;
  
  if ((ppPublicKey != (PublicKey **)0x0) && (sVar2 = ByteString::size(serialisedData), sVar2 != 0))
  {
    this_00 = (OSSLEDPublicKey *)operator_new(0x68);
    OSSLEDPublicKey::OSSLEDPublicKey(this_00);
    cVar1 = (**(code **)(*(long *)&this_00->super_EDPublicKey + 0x58))(this_00,serialisedData);
    if (cVar1 != '\0') {
      *ppPublicKey = (PublicKey *)this_00;
      return (bool)cVar1;
    }
    (**(code **)(*(long *)&this_00->super_EDPublicKey + 0x10))(this_00);
    return false;
  }
  return false;
}

Assistant:

bool OSSLEDDSA::reconstructPublicKey(PublicKey** ppPublicKey, ByteString& serialisedData)
{
	// Check input
	if ((ppPublicKey == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	OSSLEDPublicKey* pub = new OSSLEDPublicKey();

	if (!pub->deserialise(serialisedData))
	{
		delete pub;

		return false;
	}

	*ppPublicKey = pub;

	return true;
}